

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# crc.hpp
# Opt level: O0

void boost::deflate::detail::crc32_integral<unsigned_int,4>(uint v,uint32_t *crc)

{
  uint uVar1;
  reference pvVar2;
  pointer buf;
  int local_20;
  array<unsigned_char,_4UL> local_1c;
  int i;
  array<unsigned_char,_4UL> arr;
  uint32_t *crc_local;
  uint v_local;
  
  _i = crc;
  for (local_20 = 0; local_20 < 4; local_20 = local_20 + 1) {
    pvVar2 = std::array<unsigned_char,_4UL>::operator[](&local_1c,(long)local_20);
    *pvVar2 = (value_type_conflict2)(v >> ((byte)(local_20 << 3) & 0x1f));
  }
  buf = std::array<unsigned_char,_4UL>::data(&local_1c);
  uVar1 = crc32(buf,4,*_i);
  *_i = uVar1;
  return;
}

Assistant:

void crc32_integral(T v, std::uint32_t& crc) {
    static_assert(std::is_integral<T>::value, "T must be an integral type");
    std::array<unsigned char, I> arr;
    for(int i = 0; i < I; ++i)
        arr[i] = (v >> (i * 8));
    crc = crc32(arr.data(), I, crc);
}